

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int stats_arenas_i_bins_j_batch_pushed_elems_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  ctl_arena_t *pcVar2;
  int iVar3;
  size_t __n;
  uint64_t oldval;
  
  malloc_mutex_lock((tsdn_t *)tsd,&ctl_mtx);
  if (newp == (void *)0x0 && newlen == 0) {
    pcVar2 = arenas_i(mib[2]);
    oldval = pcVar2->astats->bstats[mib[4]].stats_data.batch_pushed_elems;
    iVar3 = 0;
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      uVar1 = *oldlenp;
      if (uVar1 == 8) {
        *(uint64_t *)oldp = oldval;
        iVar3 = 0;
      }
      else {
        __n = 8;
        if (uVar1 < 8) {
          __n = uVar1;
        }
        switchD_0193dc74::default(oldp,&oldval,__n);
        *oldlenp = __n;
        iVar3 = 0x16;
      }
    }
  }
  else {
    iVar3 = 1;
  }
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar3;
}

Assistant:

static const ctl_named_node_t *
stats_arenas_i_bins_j_index(tsdn_t *tsdn, const size_t *mib,
    size_t miblen, size_t j) {
	if (j > SC_NBINS) {
		return NULL;
	}
	return super_stats_arenas_i_bins_j_node;
}